

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.h
# Opt level: O3

AffixTokenMatcherWarehouse * __thiscall
icu_63::numparse::impl::AffixTokenMatcherWarehouse::operator=
          (AffixTokenMatcherWarehouse *this,AffixTokenMatcherWarehouse *param_1)

{
  long lVar1;
  
  this->fSetupData = param_1->fSetupData;
  icu_63::UnicodeString::moveFrom
            (&(this->fMinusSign).super_SymbolMatcher.fString,
             &(param_1->fMinusSign).super_SymbolMatcher.fString);
  (this->fMinusSign).super_SymbolMatcher.fUniSet = (param_1->fMinusSign).super_SymbolMatcher.fUniSet
  ;
  (this->fMinusSign).fAllowTrailing = (param_1->fMinusSign).fAllowTrailing;
  icu_63::UnicodeString::moveFrom
            (&(this->fPlusSign).super_SymbolMatcher.fString,
             &(param_1->fPlusSign).super_SymbolMatcher.fString);
  (this->fPlusSign).super_SymbolMatcher.fUniSet = (param_1->fPlusSign).super_SymbolMatcher.fUniSet;
  (this->fPlusSign).fAllowTrailing = (param_1->fPlusSign).fAllowTrailing;
  icu_63::UnicodeString::moveFrom
            (&(this->fPercent).super_SymbolMatcher.fString,
             &(param_1->fPercent).super_SymbolMatcher.fString);
  (this->fPercent).super_SymbolMatcher.fUniSet = (param_1->fPercent).super_SymbolMatcher.fUniSet;
  icu_63::UnicodeString::moveFrom
            (&(this->fPermille).super_SymbolMatcher.fString,
             &(param_1->fPermille).super_SymbolMatcher.fString);
  (this->fPermille).super_SymbolMatcher.fUniSet = (param_1->fPermille).super_SymbolMatcher.fUniSet;
  *(undefined8 *)(this->fCurrency).fCurrencyCode = *(undefined8 *)(param_1->fCurrency).fCurrencyCode
  ;
  icu_63::UnicodeString::moveFrom(&(this->fCurrency).fCurrency1,&(param_1->fCurrency).fCurrency1);
  icu_63::UnicodeString::moveFrom(&(this->fCurrency).fCurrency2,&(param_1->fCurrency).fCurrency2);
  (this->fCurrency).fUseFullCurrencyData = (param_1->fCurrency).fUseFullCurrencyData;
  lVar1 = 0x1f0;
  do {
    icu_63::UnicodeString::moveFrom
              ((UnicodeString *)((long)&this->fSetupData + lVar1),
               (UnicodeString *)((long)&param_1->fSetupData + lVar1));
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0x370);
  icu_63::UnicodeString::moveFrom
            (&(this->fCurrency).afterPrefixInsert,&(param_1->fCurrency).afterPrefixInsert);
  icu_63::UnicodeString::moveFrom
            (&(this->fCurrency).beforeSuffixInsert,&(param_1->fCurrency).beforeSuffixInsert);
  CharString::operator=(&(this->fCurrency).fLocaleName,&(param_1->fCurrency).fLocaleName);
  CodePointMatcherWarehouse::operator=(&this->fCodePoints,&param_1->fCodePoints);
  return this;
}

Assistant:

class U_I18N_API AffixTokenMatcherWarehouse : public UMemory {
  public:
    AffixTokenMatcherWarehouse() = default;  // WARNING: Leaves the object in an unusable state

    AffixTokenMatcherWarehouse(const AffixTokenMatcherSetupData* setupData);

    NumberParseMatcher& minusSign();

    NumberParseMatcher& plusSign();

    NumberParseMatcher& percent();

    NumberParseMatcher& permille();

    NumberParseMatcher& currency(UErrorCode& status);

    IgnorablesMatcher& ignorables();

    NumberParseMatcher& nextCodePointMatcher(UChar32 cp);

  private:
    // NOTE: The following field may be unsafe to access after construction is done!
    const AffixTokenMatcherSetupData* fSetupData;

    // NOTE: These are default-constructed and should not be used until initialized.
    MinusSignMatcher fMinusSign;
    PlusSignMatcher fPlusSign;
    PercentMatcher fPercent;
    PermilleMatcher fPermille;
    CombinedCurrencyMatcher fCurrency;

    // Use a child class for code point matchers, since it requires non-default operators.
    CodePointMatcherWarehouse fCodePoints;

    friend class AffixPatternMatcherBuilder;
    friend class AffixPatternMatcher;
}